

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::cancel_non_critical(torrent *this)

{
  bool bVar1;
  reference ptVar2;
  vector<peer_connection_*> *this_00;
  reference pppVar3;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> *pvVar4;
  piece_block *block;
  size_type sVar5;
  pending_block *k_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
  *__range3_1;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> rq;
  pending_block *k;
  iterator __end3;
  iterator __begin3;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> *__range3;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> dq;
  peer_connection *p_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<peer_connection_*> *__range2_1;
  time_critical_piece *p;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  *__range2;
  set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  time_critical;
  torrent *this_local;
  
  time_critical._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  ::std::
  set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ::set((set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         *)&__range2);
  __end2 = ::std::
           vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ::begin(&this->m_time_critical_pieces);
  p = (time_critical_piece *)
      ::std::
      vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
      ::end(&this->m_time_critical_pieces);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
                                     *)&p), bVar1) {
    ptVar2 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
             ::operator*(&__end2);
    ::std::
    set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ::insert((set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              *)&__range2,&ptVar2->piece);
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::time_critical_piece_*,_std::vector<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>_>
    ::operator++(&__end2);
  }
  this_00 = &(this->super_torrent_hot_members).m_connections;
  __end2_1 = ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin(&this_00->
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    );
  p_1 = (peer_connection *)
        ::std::
        vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ::end(&this_00->
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                             *)&p_1), bVar1) {
    pppVar3 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
              ::operator*(&__end2_1);
    dq.
    super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*pppVar3;
    pvVar4 = peer_connection::download_queue
                       ((peer_connection *)
                        dq.
                        super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>::
    vector((vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
            *)&__range3,pvVar4);
    __end3 = ::std::
             vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
             ::begin((vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                      *)&__range3);
    k = (pending_block *)
        ::std::
        vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>::end
                  ((vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                    *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<libtorrent::aux::pending_block_*,_std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>_>
                                       *)&k), bVar1) {
      rq.
      super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           __gnu_cxx::
           __normal_iterator<libtorrent::aux::pending_block_*,_std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>_>
           ::operator*(&__end3);
      sVar5 = ::std::
              set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ::count((set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       *)&__range2,
                      (key_type *)
                      rq.
                      super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (((sVar5 == 0) &&
          ((*(uint *)&(rq.
                       super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x8 >> 0x1d & 1)
           == 0)) &&
         ((*(uint *)&(rq.
                      super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x8 >> 0x1e & 1) ==
          0)) {
        peer_connection::cancel_request
                  ((peer_connection *)
                   dq.
                   super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   &(rq.
                     super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->block,true);
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::pending_block_*,_std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>_>
      ::operator++(&__end3);
    }
    pvVar4 = peer_connection::request_queue
                       ((peer_connection *)
                        dq.
                        super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>::
    vector((vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
            *)&__range3_1,pvVar4);
    __end3_1 = ::std::
               vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
               ::begin((vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                        *)&__range3_1);
    k_1 = (pending_block *)
          ::std::
          vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>::
          end((vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
               *)&__range3_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<libtorrent::aux::pending_block_*,_std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>_>
                               *)&k_1), bVar1) {
      block = &__gnu_cxx::
               __normal_iterator<libtorrent::aux::pending_block_*,_std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>_>
               ::operator*(&__end3_1)->block;
      sVar5 = ::std::
              set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ::count((set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       *)&__range2,&block->piece_index);
      if (sVar5 == 0) {
        peer_connection::cancel_request
                  ((peer_connection *)
                   dq.
                   super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,block,true);
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::pending_block_*,_std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>_>
      ::operator++(&__end3_1);
    }
    ::std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>::
    ~vector((vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
             *)&__range3_1);
    ::std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>::
    ~vector((vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
             *)&__range3);
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
    ::operator++(&__end2_1);
  }
  ::std::
  set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ::~set((set<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          *)&__range2);
  return;
}

Assistant:

void torrent::cancel_non_critical()
	{
		std::set<piece_index_t> time_critical;
		for (auto const& p : m_time_critical_pieces)
			time_critical.insert(p.piece);

		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			// for each peer, go through its download and request queue
			// and cancel everything, except pieces that are time critical

			// make a copy of the download queue since we may be cancelling entries
			// from it from within the loop
			std::vector<pending_block> dq = p->download_queue();
			for (auto const& k : dq)
			{
				if (time_critical.count(k.block.piece_index)) continue;
				if (k.not_wanted || k.timed_out) continue;
				p->cancel_request(k.block, true);
			}

			// make a copy of the download queue since we may be cancelling entries
			// from it from within the loop
			std::vector<pending_block> rq = p->request_queue();
			for (auto const& k : rq)
			{
				if (time_critical.count(k.block.piece_index)) continue;
				p->cancel_request(k.block, true);
			}
		}
	}